

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O3

_Bool export_ssh2(Filename *filename,int type,ssh2_userkey *key,char *passphrase)

{
  BinarySink *pBVar1;
  BinarySink *bs;
  _func_void_ssh_key_ptr **pp_Var2;
  uint uVar3;
  ptrlen input;
  ptrlen input_00;
  char *pcVar4;
  _Bool _Var5;
  uint8_t uVar6;
  uint uVar7;
  ssh_key *psVar8;
  strbuf *psVar9;
  strbuf *psVar10;
  mp_int *n;
  mp_int *r;
  mp_int *r_00;
  mp_int *x;
  mp_int *x_00;
  size_t sVar11;
  size_t sVar12;
  uint8_t *puVar13;
  void **ppvVar14;
  size_t sVar15;
  FILE *pFVar16;
  int iVar17;
  size_t *psVar18;
  size_t *psVar19;
  int len;
  char *pcVar20;
  void *pvVar21;
  size_t *psVar22;
  void **ppvVar23;
  ulong uVar24;
  size_t *psVar25;
  void **ppvVar26;
  size_t *psVar27;
  ulong *puVar28;
  void **ppvVar29;
  void **ppvVar30;
  uint8_t *puVar31;
  long lVar32;
  ssh_keyalg *psVar33;
  uint uVar34;
  ulong *puVar35;
  bool bVar36;
  ptrlen pl;
  ptrlen bytes;
  ptrlen passphrase_00;
  ptrlen pVar37;
  ptrlen pVar38;
  ptrlen pVar39;
  ptrlen pVar40;
  ptrlen pVar41;
  char zero [1];
  uchar iv [8];
  uint8_t padding_buf [8];
  BinarySource src [1];
  uint8_t local_1c1;
  uchar *local_1c0;
  strbuf *local_1b8;
  char *local_1b0;
  ssh_keyalg *local_1a8;
  uint8_t *local_1a0;
  uint8_t *local_198;
  uint8_t *local_190;
  void *local_188;
  size_t local_180;
  strbuf *local_178;
  strbuf *local_170;
  strbuf *local_168;
  char *local_160;
  uint8_t *local_158;
  strbuf *local_150;
  Filename *local_148;
  undefined8 local_140;
  uint8_t *local_138;
  size_t local_130;
  void *local_128;
  size_t local_120;
  void *local_118;
  size_t local_110;
  void *local_108;
  size_t local_100;
  void *local_f8;
  size_t local_f0;
  void *local_e8;
  size_t local_e0;
  void *local_d8;
  ulong local_d0;
  void *local_c8;
  ulong local_c0;
  void *local_b8;
  size_t local_b0;
  void *local_a8;
  void *local_a0;
  size_t local_98;
  void *local_90;
  size_t local_88;
  void *local_80;
  uint8_t local_78 [32];
  BinarySource local_58;
  
  local_160 = passphrase;
  if (type == 7) {
    psVar9 = strbuf_new();
    (*key->key->vt->public_blob)(key->key,psVar9->binarysink_);
    psVar10 = strbuf_new_nm();
    (*key->key->vt->private_blob)(key->key,psVar10->binarysink_);
    psVar33 = key->key->vt;
    if (psVar33 == &ssh_rsa) {
      local_58.data = psVar9->u;
      local_58.len = psVar9->len;
      local_58.pos = 0;
      local_58.err = BSE_NO_ERROR;
      local_1a8 = psVar33;
      local_168 = psVar9;
      local_148 = filename;
      local_58.binarysource_ = &local_58;
      BinarySource_get_string(&local_58);
      pVar39 = BinarySource_get_string(local_58.binarysource_);
      local_198 = (uint8_t *)pVar39.len;
      local_158 = (uint8_t *)pVar39.ptr;
      pVar39 = BinarySource_get_string(local_58.binarysource_);
      local_178 = (strbuf *)pVar39.len;
      local_190 = (uint8_t *)pVar39.ptr;
      local_58.data = psVar10->u;
      local_58.len = psVar10->len;
      local_58.pos = 0;
      local_58.err = BSE_NO_ERROR;
      local_170 = psVar10;
      local_58.binarysource_ = &local_58;
      pVar37 = BinarySource_get_string(&local_58);
      local_150 = (strbuf *)pVar37.len;
      pVar39 = BinarySource_get_string(local_58.binarysource_);
      local_1a0 = (uint8_t *)pVar39.len;
      local_188 = pVar39.ptr;
      pVar39 = BinarySource_get_string(local_58.binarysource_);
      local_1b0 = (char *)pVar39.len;
      local_1c0 = (uchar *)pVar39.ptr;
      pVar40 = BinarySource_get_string(local_58.binarysource_);
      pVar39.len = (size_t)local_1a0;
      pVar39.ptr = local_188;
      local_180 = pVar40.len;
      local_1b8 = (strbuf *)pVar40.ptr;
      if ((local_58.binarysource_)->err != BSE_NO_ERROR) {
        __assert_fail("!get_err(src)",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/import.c",
                      0x899,"_Bool sshcom_write(const Filename *, ssh2_userkey *, const char *)");
      }
      ppvVar14 = &local_118;
      ppvVar29 = &local_108;
      ppvVar23 = &local_e8;
      psVar18 = &local_120;
      psVar25 = &local_110;
      psVar22 = &local_100;
      psVar27 = &local_f0;
      psVar19 = &local_e0;
      local_138 = local_158;
      local_130 = (size_t)local_198;
      iVar17 = 6;
      pcVar20 = "if-modn{sign{rsa-pkcs1-sha1},encrypt{rsa-pkcs1v2-oaep}}";
      ppvVar26 = &local_f8;
      puVar31 = local_190;
      local_128 = pVar37.ptr;
LAB_0011455b:
      local_180 = pVar40.len;
      local_1b8 = (strbuf *)pVar40.ptr;
      local_1a0 = (uint8_t *)pVar39.len;
      local_188 = pVar39.ptr;
      *psVar18 = (size_t)local_150;
      *ppvVar14 = puVar31;
      *psVar25 = (size_t)local_178;
      *ppvVar29 = local_1b8;
      *psVar22 = local_180;
      *ppvVar26 = local_1c0;
      *psVar27 = (size_t)local_1b0;
      *ppvVar23 = local_188;
      *psVar19 = (size_t)local_1a0;
      psVar9 = strbuf_new_nm();
      pBVar1 = psVar9->binarysink_;
      BinarySink_put_uint32(pBVar1,0x3f6ff9eb);
      BinarySink_put_uint32(pBVar1,0);
      BinarySink_put_stringz(pBVar1,pcVar20);
      pcVar20 = "3des-cbc";
      if (local_160 == (char *)0x0) {
        pcVar20 = "none";
      }
      BinarySink_put_stringz(pBVar1,pcVar20);
      sVar11 = psVar9->len;
      BinarySink_put_uint32(pBVar1,0);
      BinarySink_put_uint32(pBVar1,0);
      if (local_1a8 != &ssh_rsa) {
        BinarySink_put_uint32(pBVar1,0);
      }
      uVar24 = 0;
      do {
        pVar37.len = *(size_t *)((long)&local_130 + uVar24);
        pVar37.ptr = *(void **)((long)&local_138 + uVar24);
        BinarySink_put_mp_sshcom_from_string(pBVar1,pVar37);
        uVar24 = uVar24 + 0x10;
      } while ((uint)(iVar17 << 4) != uVar24);
      uVar34 = (uint)sVar11;
      uVar7 = ((int)psVar9->len - uVar34) - 8;
      *(uint *)(psVar9->s + (long)(int)uVar34 + 4) =
           uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 * 0x1000000;
      if (local_160 != (char *)0x0) {
        uVar24 = (ulong)((uVar34 ^ 4) - (int)psVar9->len & 7);
        random_read(local_78,uVar24);
        BinarySink_put_data(pBVar1,local_78,uVar24);
      }
      pcVar4 = local_160;
      pcVar20 = psVar9->s;
      uVar7 = ((int)psVar9->len - uVar34) - 4;
      if ((local_160 != (char *)0x0) && ((uVar7 & 7) != 0)) {
        __assert_fail("!passphrase || cipherlen % 8 == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/import.c",
                      0x8e0,"_Bool sshcom_write(const Filename *, ssh2_userkey *, const char *)");
      }
      *(uint *)(pcVar20 + (int)uVar34) =
           uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 * 0x1000000;
      uVar3 = (uint)psVar9->len;
      *(uint *)(psVar9->s + 4) =
           uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      if (local_160 != (char *)0x0) {
        sVar15 = strlen(local_160);
        pVar38.len = sVar15;
        pVar38.ptr = pcVar4;
        sshcom_derivekey(pVar38,local_78);
        local_140 = 0;
        des3_encrypt_pubkey_ossh(local_78,&local_140,pcVar20 + (long)(int)uVar34 + 4,uVar7);
        smemclr(local_78,0x20);
      }
      pFVar16 = (FILE *)f_open(local_148,"wb",true);
      bVar36 = pFVar16 != (FILE *)0x0;
      if (bVar36) {
        fputs("---- BEGIN SSH2 ENCRYPTED PRIVATE KEY ----\n",pFVar16);
        fwrite("Comment: \"",10,1,pFVar16);
        pcVar20 = key->comment;
        sVar15 = strlen(pcVar20);
        if (0x3c < (int)sVar15) {
          lVar32 = 0x3c;
          do {
            fprintf(pFVar16,"%.*s\\\n",lVar32,pcVar20);
            pcVar20 = pcVar20 + lVar32;
            sVar15 = strlen(pcVar20);
            lVar32 = 0x46;
          } while (0x46 < (int)sVar15);
        }
        fprintf(pFVar16,"%s\"\n",pcVar20);
        input.ptr = psVar9->u;
        input.len = psVar9->len;
        base64_encode_fp((FILE *)pFVar16,input,0x46);
        fputs("---- END SSH2 ENCRYPTED PRIVATE KEY ----\n",pFVar16);
        fclose(pFVar16);
      }
      strbuf_free(psVar9);
      psVar9 = local_168;
      psVar10 = local_170;
    }
    else {
      bVar36 = false;
      if (psVar33 == &ssh_dsa) {
        local_58.data = psVar9->u;
        local_58.len = psVar9->len;
        local_58.pos = 0;
        local_58.err = BSE_NO_ERROR;
        local_1a8 = psVar33;
        local_168 = psVar9;
        local_148 = filename;
        local_58.binarysource_ = &local_58;
        BinarySource_get_string(&local_58);
        pVar39 = BinarySource_get_string(local_58.binarysource_);
        local_150 = (strbuf *)pVar39.len;
        local_190 = (uint8_t *)pVar39.ptr;
        pVar39 = BinarySource_get_string(local_58.binarysource_);
        local_180 = pVar39.len;
        local_1b8 = (strbuf *)pVar39.ptr;
        pVar37 = BinarySource_get_string(local_58.binarysource_);
        local_178 = (strbuf *)pVar37.len;
        pVar39 = BinarySource_get_string(local_58.binarysource_);
        local_1b0 = (char *)pVar39.len;
        local_1c0 = (uchar *)pVar39.ptr;
        local_58.data = psVar10->u;
        local_58.len = psVar10->len;
        local_58.pos = 0;
        local_58.err = BSE_NO_ERROR;
        local_170 = psVar10;
        local_58.binarysource_ = &local_58;
        pVar39 = BinarySource_get_string(&local_58);
        pVar40.len = local_180;
        pVar40.ptr = local_1b8;
        local_1a0 = (uint8_t *)pVar39.len;
        local_188 = pVar39.ptr;
        if ((local_58.binarysource_)->err != BSE_NO_ERROR) {
          __assert_fail("!get_err(src)",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/import.c"
                        ,0x8b5,"_Bool sshcom_write(const Filename *, ssh2_userkey *, const char *)")
          ;
        }
        psVar18 = &local_130;
        ppvVar14 = &local_128;
        local_138 = local_190;
        iVar17 = 5;
        pcVar20 = "dl-modp{sign{dsa-nist-sha1},dh{plain}}";
        psVar25 = &local_120;
        psVar22 = &local_110;
        psVar27 = &local_100;
        ppvVar29 = &local_118;
        psVar19 = &local_f0;
        ppvVar26 = &local_108;
        ppvVar23 = &local_f8;
        puVar31 = (uint8_t *)pVar37.ptr;
        goto LAB_0011455b;
      }
    }
    if (psVar10 != (strbuf *)0x0) {
      strbuf_free(psVar10);
    }
    goto joined_r0x0011481c;
  }
  if (type == 6) {
LAB_00114014:
    _Var5 = openssh_new_write(filename,key,passphrase);
    return _Var5;
  }
  if (type != 4) {
    return false;
  }
  psVar8 = (*key->key->vt->base_key)(key->key);
  psVar33 = psVar8->vt;
  if ((((psVar33 != &ssh_ecdsa_nistp521) && (psVar33 != &ssh_ecdsa_nistp384)) &&
      (psVar33 != &ssh_ecdsa_nistp256)) && ((psVar33 != &ssh_dsa && (psVar33 != &ssh_rsa))))
  goto LAB_00114014;
  psVar8 = (*key->key->vt->base_key)(key->key);
  psVar9 = strbuf_new();
  (*psVar8->vt->public_blob)(psVar8,psVar9->binarysink_);
  psVar10 = strbuf_new_nm();
  (*psVar8->vt->private_blob)(psVar8,psVar10->binarysink_);
  local_1a8 = (ssh_keyalg *)strbuf_new_nm();
  psVar33 = psVar8->vt;
  local_178 = psVar9;
  local_150 = psVar10;
  if (psVar33 == &ssh_rsa) {
    local_58.data = psVar9->u;
    local_58.len = psVar9->len;
    local_58.pos = 0;
    local_58.err = BSE_NO_ERROR;
    local_148 = filename;
    local_58.binarysource_ = &local_58;
    BinarySource_get_string(&local_58);
    pVar39 = BinarySource_get_string(local_58.binarysource_);
    local_198 = (uint8_t *)pVar39.len;
    local_1b0 = (char *)pVar39.ptr;
    pVar39 = BinarySource_get_string(local_58.binarysource_);
    local_98 = pVar39.len;
    local_90 = pVar39.ptr;
    local_58.data = psVar10->u;
    local_58.len = psVar10->len;
    local_58.pos = 0;
    local_58.err = BSE_NO_ERROR;
    local_58.binarysource_ = &local_58;
    pVar39 = BinarySource_get_string(&local_58);
    local_1c0 = (uchar *)pVar39.len;
    pVar40 = BinarySource_get_string(local_58.binarysource_);
    pVar37 = BinarySource_get_string(local_58.binarysource_);
    pVar38 = BinarySource_get_string(local_58.binarysource_);
    local_88 = pVar38.len;
    local_80 = pVar38.ptr;
    if ((local_58.binarysource_)->err != BSE_NO_ERROR) {
      __assert_fail("!get_err(src)",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/import.c",
                    0x36c,"_Bool openssh_pem_write(const Filename *, ssh2_userkey *, const char *)")
      ;
    }
    bytes.len = (size_t)local_1c0;
    bytes.ptr = pVar39.ptr;
    local_a8 = pVar39.ptr;
    n = mp_from_bytes_be(bytes);
    local_168 = (strbuf *)pVar40.len;
    local_a0 = pVar40.ptr;
    r = mp_from_bytes_be(pVar40);
    local_190 = (uint8_t *)pVar37.len;
    local_170 = (strbuf *)pVar37.ptr;
    r_00 = mp_from_bytes_be(pVar37);
    mp_sub_integer_into(r,r,1);
    mp_sub_integer_into(r_00,r_00,1);
    x = mp_mod(n,r);
    x_00 = mp_mod(n,r_00);
    mp_free(n);
    mp_free(r);
    mp_free(r_00);
    sVar11 = mp_get_nbits(x);
    psVar9 = (strbuf *)(sVar11 + 8 >> 3);
    sVar12 = mp_get_nbits(x_00);
    local_188 = (void *)(sVar12 + 8 >> 3);
    local_180 = (size_t)((int)local_188 + (int)psVar9);
    local_1b8 = psVar9;
    puVar13 = (uint8_t *)safemalloc(local_180,1,0);
    puVar31 = puVar13;
    psVar9 = local_1b8;
    local_1a0 = puVar13;
    if (sVar11 < 0xfffffffffffffff8) {
      do {
        psVar9 = (strbuf *)((long)&psVar9[-1].binarysink_[0].binarysink_ + 7);
        uVar6 = mp_get_byte(x,(size_t)psVar9);
        *puVar31 = uVar6;
        puVar31 = puVar31 + 1;
      } while (psVar9 != (strbuf *)0x0);
    }
    puVar13 = puVar13 + (long)local_1b8;
    puVar31 = puVar13;
    pvVar21 = local_188;
    if (sVar12 < 0xfffffffffffffff8) {
      do {
        pvVar21 = (void *)((long)pvVar21 - 1);
        uVar6 = mp_get_byte(x_00,(size_t)pvVar21);
        *puVar31 = uVar6;
        puVar31 = puVar31 + 1;
      } while (pvVar21 != (void *)0x0);
    }
    ppvVar23 = &local_d8;
    puVar35 = &local_d0;
    ppvVar30 = &local_b8;
    psVar22 = &local_b0;
    local_158 = puVar13;
    mp_free(x);
    mp_free(x_00);
    local_128 = local_90;
    local_120 = local_98;
    local_118 = local_1b0;
    local_110 = (size_t)local_198;
    local_108 = local_a8;
    local_100 = (size_t)local_1c0;
    iVar17 = 9;
    local_1b0 = "-----BEGIN RSA PRIVATE KEY-----\n";
    local_1c0 = "-----END RSA PRIVATE KEY-----\n";
    ppvVar14 = &local_f8;
    psVar18 = &local_f0;
    ppvVar29 = &local_e8;
    psVar25 = &local_e0;
    ppvVar26 = &local_c8;
    puVar28 = &local_c0;
    local_198 = local_1a0;
    pVar41.len = local_88;
    pVar41.ptr = local_80;
    pvVar21 = local_a0;
LAB_00114c86:
    local_138 = &local_1c1;
    local_130 = 1;
    local_1c1 = '\0';
    *ppvVar14 = pvVar21;
    *psVar18 = (size_t)local_168;
    *ppvVar29 = local_170;
    *psVar25 = (size_t)local_190;
    *ppvVar23 = local_1a0;
    *puVar35 = (ulong)local_1b8;
    *ppvVar26 = local_158;
    *puVar28 = (ulong)local_188;
    *ppvVar30 = pVar41.ptr;
    *psVar22 = pVar41.len;
    psVar9 = strbuf_new_nm();
    uVar24 = 0;
    do {
      sVar11 = *(size_t *)((long)&local_130 + uVar24);
      BinarySink_put_ber_id_len(psVar9->binarysink_,2,(int)sVar11,0);
      pl.len = sVar11;
      pl.ptr = *(void **)((long)&local_138 + uVar24);
      BinarySink_put_datapl(psVar9->binarysink_,pl);
      psVar33 = local_1a8;
      uVar24 = uVar24 + 0x10;
    } while ((uint)(iVar17 << 4) != uVar24);
    pp_Var2 = &local_1a8->freekey;
    BinarySink_put_ber_id_len((BinarySink *)pp_Var2,0x10,(int)psVar9->len,0x20);
    BinarySink_put_data((BinarySink *)pp_Var2,psVar9->s,psVar9->len);
    strbuf_free(psVar9);
    puVar31 = local_198;
  }
  else {
    if (psVar33 == &ssh_dsa) {
      local_58.data = psVar9->u;
      local_58.len = psVar9->len;
      local_58.pos = 0;
      local_58.err = BSE_NO_ERROR;
      local_148 = filename;
      local_58.binarysource_ = &local_58;
      BinarySource_get_string(&local_58);
      pVar39 = BinarySource_get_string(local_58.binarysource_);
      local_168 = (strbuf *)pVar39.len;
      pVar40 = BinarySource_get_string(local_58.binarysource_);
      local_190 = (uint8_t *)pVar40.len;
      local_170 = (strbuf *)pVar40.ptr;
      pVar40 = BinarySource_get_string(local_58.binarysource_);
      local_1b8 = (strbuf *)pVar40.len;
      local_1a0 = (uint8_t *)pVar40.ptr;
      pVar40 = BinarySource_get_string(local_58.binarysource_);
      local_188 = (void *)pVar40.len;
      local_158 = (uint8_t *)pVar40.ptr;
      local_58.data = psVar10->u;
      local_58.len = psVar10->len;
      local_58.pos = 0;
      local_58.err = BSE_NO_ERROR;
      local_58.binarysource_ = &local_58;
      pVar41 = BinarySource_get_string(&local_58);
      if ((local_58.binarysource_)->err != BSE_NO_ERROR) {
        __assert_fail("!get_err(src)",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/import.c",
                      0x3a4,
                      "_Bool openssh_pem_write(const Filename *, ssh2_userkey *, const char *)");
      }
      ppvVar14 = &local_128;
      psVar18 = &local_120;
      ppvVar29 = &local_118;
      psVar25 = &local_110;
      ppvVar23 = &local_108;
      puVar35 = &local_100;
      iVar17 = 6;
      local_1b0 = "-----BEGIN DSA PRIVATE KEY-----\n";
      local_1c0 = "-----END DSA PRIVATE KEY-----\n";
      local_180 = 0;
      local_198 = (uint8_t *)0x0;
      ppvVar26 = &local_f8;
      puVar28 = &local_f0;
      ppvVar30 = &local_e8;
      psVar22 = &local_e0;
      pvVar21 = pVar39.ptr;
      goto LAB_00114c86;
    }
    if (((psVar33 != &ssh_ecdsa_nistp521) && (psVar33 != &ssh_ecdsa_nistp256)) &&
       (psVar33 != &ssh_ecdsa_nistp384)) {
      local_148 = filename;
      __assert_fail("false && \"bad key alg in openssh_pem_write\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/import.c",
                    0x3f9,"_Bool openssh_pem_write(const Filename *, ssh2_userkey *, const char *)")
      ;
    }
    local_148 = filename;
    local_1c0 = ec_alg_oid(psVar33,(int *)&local_58);
    uVar7 = (uint)((ulong)((psVar8[-3].vt)->freekey + 7) >> 2);
    psVar9 = strbuf_new_nm();
    pBVar1 = psVar9->binarysink_;
    local_1b8 = psVar9;
    BinarySink_put_byte(psVar9->binarysink_[0].binarysink_,'\x02');
    BinarySink_put_byte(psVar9->binarysink_[0].binarysink_,'\x01');
    BinarySink_put_byte(pBVar1,'\x01');
    local_180 = 0;
    BinarySink_put_ber_id_len(pBVar1,4,(int)psVar10->len + -4,0);
    BinarySink_put_data(pBVar1,psVar10->s + 4,psVar10->len - 4);
    psVar9 = strbuf_new();
    BinarySink_put_ber_id_len(psVar9->binarysink_,6,(int)local_58.data,0);
    BinarySink_put_data(psVar9->binarysink_,local_1c0,(long)(int)local_58.data);
    BinarySink_put_ber_id_len(pBVar1,0,(int)psVar9->len,0xa0);
    BinarySink_put_data(pBVar1,psVar9->s,psVar9->len);
    strbuf_free(psVar9);
    psVar9 = strbuf_new();
    bs = psVar9->binarysink_;
    BinarySink_put_ber_id_len(bs,3,(uVar7 & 0xfffffffe) + 2,0);
    BinarySink_put_byte(bs,'\0');
    BinarySink_put_data(bs,local_178->s + 0x27,(long)(int)uVar7 | 1);
    BinarySink_put_ber_id_len(pBVar1,1,(int)psVar9->len,0xa0);
    BinarySink_put_data(pBVar1,psVar9->s,psVar9->len);
    strbuf_free(psVar9);
    psVar33 = local_1a8;
    psVar9 = local_1b8;
    pp_Var2 = &local_1a8->freekey;
    BinarySink_put_ber_id_len((BinarySink *)pp_Var2,0x10,(int)local_1b8->len,0x20);
    BinarySink_put_data((BinarySink *)pp_Var2,psVar9->s,psVar9->len);
    strbuf_free(psVar9);
    local_1b0 = "-----BEGIN EC PRIVATE KEY-----\n";
    local_1c0 = "-----END EC PRIVATE KEY-----\n";
    puVar31 = (uint8_t *)0x0;
  }
  pcVar20 = local_160;
  if (local_160 != (char *)0x0) {
    len = (*(uint *)&psVar33->new_priv_openssh & 0xfffffff8) + 8;
    iVar17 = len - *(uint *)&psVar33->new_priv_openssh;
    BinarySink_put_padding((BinarySink *)&psVar33->freekey,(long)iVar17,(uchar)iVar17);
    random_read(&local_140,8);
    sVar15 = strlen(pcVar20);
    passphrase_00.len = sVar15;
    passphrase_00.ptr = pcVar20;
    openssh_pem_derivekey(passphrase_00,&local_140,local_78);
    des3_encrypt_pubkey_ossh(local_78,&local_140,local_1a8->new_priv,len);
    psVar33 = local_1a8;
    smemclr(local_78,0x20);
  }
  pFVar16 = (FILE *)f_open(local_148,"wb",true);
  bVar36 = pFVar16 != (FILE *)0x0;
  if (pFVar16 == (FILE *)0x0) {
    psVar9 = local_178;
    if (psVar33 != (ssh_keyalg *)0x0) goto LAB_00114eaf;
  }
  else {
    fputs(local_1b0,pFVar16);
    psVar9 = local_178;
    if (pcVar20 != (char *)0x0) {
      fwrite("Proc-Type: 4,ENCRYPTED\nDEK-Info: DES-EDE3-CBC,",0x2e,1,pFVar16);
      lVar32 = 0;
      do {
        fprintf(pFVar16,"%02X",(ulong)*(byte *)((long)&local_140 + lVar32));
        lVar32 = lVar32 + 1;
      } while (lVar32 != 8);
      fwrite("\n\n",2,1,pFVar16);
      psVar33 = local_1a8;
    }
    input_00.ptr = psVar33->new_priv;
    input_00.len = (size_t)psVar33->new_priv_openssh;
    base64_encode_fp((FILE *)pFVar16,input_00,0x40);
    fputs((char *)local_1c0,pFVar16);
    fclose(pFVar16);
LAB_00114eaf:
    strbuf_free((strbuf *)psVar33);
  }
  if (puVar31 != (uint8_t *)0x0) {
    smemclr(puVar31,local_180);
    safefree(puVar31);
  }
  if (local_150 != (strbuf *)0x0) {
    strbuf_free(local_150);
  }
joined_r0x0011481c:
  if (psVar9 != (strbuf *)0x0) {
    strbuf_free(psVar9);
  }
  return bVar36;
}

Assistant:

bool export_ssh2(const Filename *filename, int type,
                 ssh2_userkey *key, char *passphrase)
{
    if (type == SSH_KEYTYPE_OPENSSH_AUTO)
        return openssh_auto_write(filename, key, passphrase);
    if (type == SSH_KEYTYPE_OPENSSH_NEW)
        return openssh_new_write(filename, key, passphrase);
    if (type == SSH_KEYTYPE_SSHCOM)
        return sshcom_write(filename, key, passphrase);
    return false;
}